

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O0

void __thiscall SortedRun::do_and(SortedRun *this,SortedRun *other)

{
  bool bVar1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  SortedRun *in_RDI;
  IntersectionHelper helper;
  iterator new_end;
  IntersectionHelper *in_stack_ffffffffffffff50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  SortedRun *in_stack_ffffffffffffff90;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff98;
  IntersectionHelper local_50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18 [3];
  
  decompress(in_stack_ffffffffffffff90);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
  __normal_iterator(local_18);
  bVar1 = is_compressed((SortedRun *)0x20ba72);
  if (bVar1) {
    IntersectionHelper::IntersectionHelper
              ((IntersectionHelper *)in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    IntersectionHelper::intersect(in_stack_ffffffffffffff50);
    begin(in_RDI);
    IntersectionHelper::result_size(&local_50);
    local_18[0] = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator+(in_stack_ffffffffffffff58,(difference_type)in_stack_ffffffffffffff50);
  }
  else {
    __last1 = begin(in_RDI);
    __first2 = end(in_RDI);
    __last2 = begin(in_RDI);
    in_stack_ffffffffffffff78 = end(in_RDI);
    in_stack_ffffffffffffff70 = begin(in_RDI);
    local_18[0] = std::
                  set_intersection<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (in_stack_ffffffffffffff98,__last1._M_current,__first2._M_current,
                             __last2._M_current,in_stack_ffffffffffffff78._M_current);
  }
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_RDI);
  end(in_RDI);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
            (in_stack_ffffffffffffff68,(const_iterator)in_stack_ffffffffffffff78._M_current,
             (const_iterator)in_stack_ffffffffffffff70._M_current);
  return;
}

Assistant:

void SortedRun::do_and(SortedRun &other) {
    decompress();
    std::vector<uint32_t>::iterator new_end;
    if (other.is_compressed()) {
        IntersectionHelper helper(&sequence_, &other.run_);
        helper.intersect();
        new_end = begin() + helper.result_size();
    } else {
        new_end = std::set_intersection(other.begin(), other.end(), begin(),
                                        end(), begin());
    }
    sequence_.erase(new_end, end());
}